

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O2

int xmlInitSAXParserCtxt(xmlParserCtxtPtr ctxt,xmlSAXHandler *sax,void *userData)

{
  byte *pbVar1;
  int iVar2;
  xmlDictPtr dict;
  _xmlSAXHandler *__s;
  xmlParserInputPtr *ppxVar3;
  xmlParserInputPtr input;
  xmlNodePtr *ppxVar4;
  xmlChar **ppxVar5;
  int *piVar6;
  size_t __n;
  code *pcVar7;
  
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    xmlErrInternal((xmlParserCtxtPtr)0x0,"Got NULL parser context\n",(xmlChar *)0x0);
    return -1;
  }
  xmlInitParser();
  dict = ctxt->dict;
  if (dict == (xmlDictPtr)0x0) {
    dict = xmlDictCreate();
    ctxt->dict = dict;
    if (dict == (xmlDictPtr)0x0) goto LAB_00167f7e;
  }
  xmlDictSetLimit(dict,10000000);
  __s = ctxt->sax;
  if (__s == (_xmlSAXHandler *)0x0) {
    __s = (_xmlSAXHandler *)(*xmlMalloc)(0x100);
    ctxt->sax = __s;
    if (__s == (_xmlSAXHandler *)0x0) {
LAB_00167f7e:
      xmlErrMemory((xmlParserCtxtPtr)0x0,"cannot initialize parser context\n");
      return -1;
    }
  }
  if (sax == (xmlSAXHandler *)0x0) {
    memset(__s,0,0x100);
    xmlSAXVersion(ctxt->sax,2);
    userData = ctxt;
  }
  else {
    if (sax->initialized == 0xdeedbeaf) {
      __n = 0x100;
    }
    else {
      memset(__s,0,0x100);
      __s = ctxt->sax;
      __n = 0xe0;
    }
    memcpy(__s,sax,__n);
    if (userData == (void *)0x0) {
      userData = ctxt;
    }
  }
  ctxt->userData = userData;
  ctxt->maxatts = 0;
  ctxt->atts = (xmlChar **)0x0;
  if (ctxt->inputTab == (xmlParserInputPtr *)0x0) {
    ppxVar3 = (xmlParserInputPtr *)(*xmlMalloc)(0x28);
    ctxt->inputTab = ppxVar3;
    ctxt->inputMax = 5;
    if (ppxVar3 == (xmlParserInputPtr *)0x0) {
      xmlErrMemory((xmlParserCtxtPtr)0x0,"cannot initialize parser context\n");
      ctxt->input = (xmlParserInputPtr)0x0;
      ctxt->inputNr = 0;
      ctxt->inputMax = 0;
      return -1;
    }
  }
  while (input = inputPop(ctxt), input != (xmlParserInputPtr)0x0) {
    xmlFreeInputStream(input);
  }
  ctxt->inputNr = 0;
  ctxt->input = (xmlParserInputPtr)0x0;
  ctxt->version = (xmlChar *)0x0;
  ctxt->encoding = (xmlChar *)0x0;
  ctxt->standalone = -1;
  ctxt->html = 0;
  ctxt->hasExternalSubset = 0;
  ctxt->hasPErefs = 0;
  ppxVar3 = &ctxt->input;
  ctxt->external = 0;
  ctxt->instate = XML_PARSER_START;
  ctxt->token = 0;
  ctxt->directory = (char *)0x0;
  if (ctxt->nodeTab == (xmlNodePtr *)0x0) {
    ppxVar4 = (xmlNodePtr *)(*xmlMalloc)(0x50);
    ctxt->nodeTab = ppxVar4;
    ctxt->nodeMax = 10;
    if (ppxVar4 == (xmlNodePtr *)0x0) {
      xmlErrMemory((xmlParserCtxtPtr)0x0,"cannot initialize parser context\n");
      *ppxVar3 = (xmlParserInputPtr)0x0;
      ctxt->inputNr = 0;
      ctxt->inputMax = 0;
      ctxt->node = (xmlNodePtr)0x0;
      ctxt->nodeNr = 0;
      ctxt->nodeMax = 0;
      return -1;
    }
  }
  ctxt->nodeNr = 0;
  ctxt->node = (xmlNodePtr)0x0;
  if (ctxt->nameTab == (xmlChar **)0x0) {
    ppxVar5 = (xmlChar **)(*xmlMalloc)(0x50);
    ctxt->nameTab = ppxVar5;
    ctxt->nameMax = 10;
    if (ppxVar5 == (xmlChar **)0x0) {
      xmlErrMemory((xmlParserCtxtPtr)0x0,"cannot initialize parser context\n");
      *ppxVar3 = (xmlParserInputPtr)0x0;
      ctxt->inputNr = 0;
      ctxt->inputMax = 0;
      ctxt->node = (xmlNodePtr)0x0;
      ctxt->nodeNr = 0;
      ctxt->nodeMax = 0;
      ctxt->name = (xmlChar *)0x0;
      ctxt->nameNr = 0;
      ctxt->nameMax = 0;
      return -1;
    }
  }
  ctxt->nameNr = 0;
  ctxt->name = (xmlChar *)0x0;
  piVar6 = ctxt->spaceTab;
  if (piVar6 == (int *)0x0) {
    piVar6 = (int *)(*xmlMalloc)(0x28);
    ctxt->spaceTab = piVar6;
    ctxt->spaceMax = 10;
    if (piVar6 == (int *)0x0) {
      xmlErrMemory((xmlParserCtxtPtr)0x0,"cannot initialize parser context\n");
      *ppxVar3 = (xmlParserInputPtr)0x0;
      ctxt->inputNr = 0;
      ctxt->inputMax = 0;
      ctxt->node = (xmlNodePtr)0x0;
      ctxt->nodeNr = 0;
      ctxt->nodeMax = 0;
      ctxt->name = (xmlChar *)0x0;
      ctxt->nameNr = 0;
      ctxt->nameMax = 0;
      ctxt->space = (int *)0x0;
      ctxt->spaceNr = 0;
      ctxt->spaceMax = 0;
      return -1;
    }
  }
  ctxt->spaceNr = 1;
  ctxt->spaceMax = 10;
  *piVar6 = -1;
  ctxt->space = piVar6;
  ctxt->myDoc = (xmlDocPtr)0x0;
  ctxt->wellFormed = 1;
  ctxt->nsWellFormed = 1;
  ctxt->valid = 1;
  piVar6 = __xmlLoadExtDtdDefaultValue();
  iVar2 = *piVar6;
  ctxt->loadsubset = iVar2;
  if (iVar2 != 0) {
    *(byte *)&ctxt->options = (byte)ctxt->options | 4;
  }
  piVar6 = __xmlDoValidityCheckingDefaultValue();
  ctxt->validate = *piVar6;
  piVar6 = __xmlPedanticParserDefaultValue();
  iVar2 = *piVar6;
  ctxt->pedantic = iVar2;
  if (iVar2 != 0) {
    *(byte *)&ctxt->options = (byte)ctxt->options | 0x80;
  }
  piVar6 = __xmlLineNumbersDefaultValue();
  ctxt->linenumbers = *piVar6;
  piVar6 = __xmlKeepBlanksDefaultValue();
  iVar2 = *piVar6;
  ctxt->keepBlanks = iVar2;
  if (iVar2 == 0) {
    ctxt->sax->ignorableWhitespace = xmlSAX2IgnorableWhitespace;
    pbVar1 = (byte *)((long)&ctxt->options + 1);
    *pbVar1 = *pbVar1 | 1;
  }
  (ctxt->vctxt).flags = 2;
  (ctxt->vctxt).userData = ctxt;
  (ctxt->vctxt).error = xmlParserValidityError;
  pcVar7 = xmlParserValidityWarning;
  (ctxt->vctxt).warning = xmlParserValidityWarning;
  if (ctxt->validate != 0) {
    piVar6 = __xmlGetWarningsDefaultValue();
    if (*piVar6 == 0) {
      pcVar7 = (xmlValidityWarningFunc)0x0;
    }
    (ctxt->vctxt).warning = pcVar7;
    (ctxt->vctxt).nodeMax = 0;
    *(byte *)&ctxt->options = (byte)ctxt->options | 0x10;
  }
  piVar6 = __xmlSubstituteEntitiesDefaultValue();
  iVar2 = *piVar6;
  ctxt->replaceEntities = iVar2;
  if (iVar2 != 0) {
    *(byte *)&ctxt->options = (byte)ctxt->options | 2;
  }
  ctxt->record_info = 0;
  ctxt->checkIndex = 0;
  ctxt->inSubset = 0;
  ctxt->errNo = 0;
  ctxt->depth = 0;
  ctxt->charset = 1;
  ctxt->catalogs = (void *)0x0;
  ctxt->sizeentcopy = 0;
  ctxt->nbentities = 0;
  ctxt->sizeentities = 0;
  ctxt->input_id = 1;
  (ctxt->node_seq).maximum = 0;
  (ctxt->node_seq).length = 0;
  (ctxt->node_seq).buffer = (xmlParserNodeInfo *)0x0;
  return 0;
}

Assistant:

static int
xmlInitSAXParserCtxt(xmlParserCtxtPtr ctxt, const xmlSAXHandler *sax,
                     void *userData)
{
    xmlParserInputPtr input;

    if(ctxt==NULL) {
        xmlErrInternal(NULL, "Got NULL parser context\n", NULL);
        return(-1);
    }

    xmlInitParser();

    if (ctxt->dict == NULL)
	ctxt->dict = xmlDictCreate();
    if (ctxt->dict == NULL) {
        xmlErrMemory(NULL, "cannot initialize parser context\n");
	return(-1);
    }
    xmlDictSetLimit(ctxt->dict, XML_MAX_DICTIONARY_LIMIT);

    if (ctxt->sax == NULL)
	ctxt->sax = (xmlSAXHandler *) xmlMalloc(sizeof(xmlSAXHandler));
    if (ctxt->sax == NULL) {
        xmlErrMemory(NULL, "cannot initialize parser context\n");
	return(-1);
    }
    if (sax == NULL) {
	memset(ctxt->sax, 0, sizeof(xmlSAXHandler));
        xmlSAXVersion(ctxt->sax, 2);
        ctxt->userData = ctxt;
    } else {
	if (sax->initialized == XML_SAX2_MAGIC) {
	    memcpy(ctxt->sax, sax, sizeof(xmlSAXHandler));
        } else {
	    memset(ctxt->sax, 0, sizeof(xmlSAXHandler));
	    memcpy(ctxt->sax, sax, sizeof(xmlSAXHandlerV1));
        }
        ctxt->userData = userData ? userData : ctxt;
    }

    ctxt->maxatts = 0;
    ctxt->atts = NULL;
    /* Allocate the Input stack */
    if (ctxt->inputTab == NULL) {
	ctxt->inputTab = (xmlParserInputPtr *)
		    xmlMalloc(5 * sizeof(xmlParserInputPtr));
	ctxt->inputMax = 5;
    }
    if (ctxt->inputTab == NULL) {
        xmlErrMemory(NULL, "cannot initialize parser context\n");
	ctxt->inputNr = 0;
	ctxt->inputMax = 0;
	ctxt->input = NULL;
	return(-1);
    }
    while ((input = inputPop(ctxt)) != NULL) { /* Non consuming */
        xmlFreeInputStream(input);
    }
    ctxt->inputNr = 0;
    ctxt->input = NULL;

    ctxt->version = NULL;
    ctxt->encoding = NULL;
    ctxt->standalone = -1;
    ctxt->hasExternalSubset = 0;
    ctxt->hasPErefs = 0;
    ctxt->html = 0;
    ctxt->external = 0;
    ctxt->instate = XML_PARSER_START;
    ctxt->token = 0;
    ctxt->directory = NULL;

    /* Allocate the Node stack */
    if (ctxt->nodeTab == NULL) {
	ctxt->nodeTab = (xmlNodePtr *) xmlMalloc(10 * sizeof(xmlNodePtr));
	ctxt->nodeMax = 10;
    }
    if (ctxt->nodeTab == NULL) {
        xmlErrMemory(NULL, "cannot initialize parser context\n");
	ctxt->nodeNr = 0;
	ctxt->nodeMax = 0;
	ctxt->node = NULL;
	ctxt->inputNr = 0;
	ctxt->inputMax = 0;
	ctxt->input = NULL;
	return(-1);
    }
    ctxt->nodeNr = 0;
    ctxt->node = NULL;

    /* Allocate the Name stack */
    if (ctxt->nameTab == NULL) {
	ctxt->nameTab = (const xmlChar **) xmlMalloc(10 * sizeof(xmlChar *));
	ctxt->nameMax = 10;
    }
    if (ctxt->nameTab == NULL) {
        xmlErrMemory(NULL, "cannot initialize parser context\n");
	ctxt->nodeNr = 0;
	ctxt->nodeMax = 0;
	ctxt->node = NULL;
	ctxt->inputNr = 0;
	ctxt->inputMax = 0;
	ctxt->input = NULL;
	ctxt->nameNr = 0;
	ctxt->nameMax = 0;
	ctxt->name = NULL;
	return(-1);
    }
    ctxt->nameNr = 0;
    ctxt->name = NULL;

    /* Allocate the space stack */
    if (ctxt->spaceTab == NULL) {
	ctxt->spaceTab = (int *) xmlMalloc(10 * sizeof(int));
	ctxt->spaceMax = 10;
    }
    if (ctxt->spaceTab == NULL) {
        xmlErrMemory(NULL, "cannot initialize parser context\n");
	ctxt->nodeNr = 0;
	ctxt->nodeMax = 0;
	ctxt->node = NULL;
	ctxt->inputNr = 0;
	ctxt->inputMax = 0;
	ctxt->input = NULL;
	ctxt->nameNr = 0;
	ctxt->nameMax = 0;
	ctxt->name = NULL;
	ctxt->spaceNr = 0;
	ctxt->spaceMax = 0;
	ctxt->space = NULL;
	return(-1);
    }
    ctxt->spaceNr = 1;
    ctxt->spaceMax = 10;
    ctxt->spaceTab[0] = -1;
    ctxt->space = &ctxt->spaceTab[0];
    ctxt->myDoc = NULL;
    ctxt->wellFormed = 1;
    ctxt->nsWellFormed = 1;
    ctxt->valid = 1;
    ctxt->loadsubset = xmlLoadExtDtdDefaultValue;
    if (ctxt->loadsubset) {
        ctxt->options |= XML_PARSE_DTDLOAD;
    }
    ctxt->validate = xmlDoValidityCheckingDefaultValue;
    ctxt->pedantic = xmlPedanticParserDefaultValue;
    if (ctxt->pedantic) {
        ctxt->options |= XML_PARSE_PEDANTIC;
    }
    ctxt->linenumbers = xmlLineNumbersDefaultValue;
    ctxt->keepBlanks = xmlKeepBlanksDefaultValue;
    if (ctxt->keepBlanks == 0) {
	ctxt->sax->ignorableWhitespace = xmlSAX2IgnorableWhitespace;
	ctxt->options |= XML_PARSE_NOBLANKS;
    }

    ctxt->vctxt.flags = XML_VCTXT_USE_PCTXT;
    ctxt->vctxt.userData = ctxt;
    ctxt->vctxt.error = xmlParserValidityError;
    ctxt->vctxt.warning = xmlParserValidityWarning;
    if (ctxt->validate) {
	if (xmlGetWarningsDefaultValue == 0)
	    ctxt->vctxt.warning = NULL;
	else
	    ctxt->vctxt.warning = xmlParserValidityWarning;
	ctxt->vctxt.nodeMax = 0;
        ctxt->options |= XML_PARSE_DTDVALID;
    }
    ctxt->replaceEntities = xmlSubstituteEntitiesDefaultValue;
    if (ctxt->replaceEntities) {
        ctxt->options |= XML_PARSE_NOENT;
    }
    ctxt->record_info = 0;
    ctxt->checkIndex = 0;
    ctxt->inSubset = 0;
    ctxt->errNo = XML_ERR_OK;
    ctxt->depth = 0;
    ctxt->charset = XML_CHAR_ENCODING_UTF8;
    ctxt->catalogs = NULL;
    ctxt->nbentities = 0;
    ctxt->sizeentities = 0;
    ctxt->sizeentcopy = 0;
    ctxt->input_id = 1;
    xmlInitNodeInfoSeq(&ctxt->node_seq);
    return(0);
}